

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malicious_aligned_heap_vectorization.cpp
# Opt level: O1

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  void *pvVar7;
  double *pdVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auStack_58 [8];
  Vector4d result;
  
  pvVar7 = operator_new(0x40);
  uVar11 = (ulong)pvVar7 & 0xffffffffffffffe0;
  *(void **)(uVar11 + 0x18) = pvVar7;
  *(undefined8 *)(uVar11 + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)(uVar11 + 0x28) = 0x3ff0000000000000;
  *(undefined8 *)(uVar11 + 0x30) = 0x3ff0000000000000;
  *(undefined8 *)(uVar11 + 0x38) = 0x3ff0000000000000;
  pvVar7 = operator_new(0x40);
  uVar10 = (ulong)pvVar7 & 0xffffffffffffffe0;
  *(void **)(uVar10 + 0x18) = pvVar7;
  *(undefined8 *)(uVar10 + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)(uVar10 + 0x28) = 0x4000000000000000;
  *(undefined8 *)(uVar10 + 0x30) = 0x4008000000000000;
  *(undefined8 *)(uVar10 + 0x38) = 0x4010000000000000;
  result.data[3] = (double)operator_new(0x20);
  uVar1 = *(undefined8 *)(uVar11 + 0x28);
  uVar2 = *(undefined8 *)(uVar11 + 0x30);
  uVar3 = *(undefined8 *)(uVar11 + 0x38);
  *(undefined8 *)result.data[3] = *(undefined8 *)(uVar11 + 0x20);
  *(undefined8 *)((long)result.data[3] + 8) = uVar1;
  *(undefined8 *)((long)result.data[3] + 0x10) = uVar2;
  *(undefined8 *)((long)result.data[3] + 0x18) = uVar3;
  pdVar8 = (double *)operator_new(0x20);
  dVar4 = *(double *)(uVar10 + 0x28);
  dVar5 = *(double *)(uVar10 + 0x30);
  dVar6 = *(double *)(uVar10 + 0x38);
  *pdVar8 = *(double *)(uVar10 + 0x20);
  pdVar8[1] = dVar4;
  pdVar8[2] = dVar5;
  pdVar8[3] = dVar6;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"address of point1: ",0x13);
  poVar9 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"address of point2: ",0x13);
  poVar9 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  dVar4 = result.data[3];
  auStack_58 = (undefined1  [8])(*(double *)result.data[3] + *pdVar8);
  result.data[0] = *(double *)((long)result.data[3] + 8) + pdVar8[1];
  result.data[1] = *(double *)((long)result.data[3] + 0x10) + pdVar8[2];
  result.data[2] = *(double *)((long)result.data[3] + 0x18) + pdVar8[3];
  operator<<((ostream *)&std::cout,(Vector4d *)auStack_58);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  operator_delete(*(void **)(uVar11 + 0x18));
  operator_delete(*(void **)(uVar10 + 0x18));
  operator_delete((void *)dVar4);
  operator_delete(pdVar8);
  return 0;
}

Assistant:

int main() {
  Vector4d* input1 = new Vector4d{1, 1, 1, 1};
  Vector4d* input2 = new Vector4d{1, 2, 3, 4};

  Point* point1 = new Point{*input1};
  Point* point2 = new Point{*input2};

  std::cout << "address of point1: " << point1->position.data << std::endl;
  std::cout << "address of point2: " << point2->position.data << std::endl;

  Vector4d result = point1->position + point2->position;

  std::cout << result << std::endl;

  delete input1;
  delete input2;
  delete point1;
  delete point2;
  return 0;
}